

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

void __thiscall
Diligent::RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::RefCntAutoPtr
          (RefCntAutoPtr<Diligent::RenderDeviceVkImpl> *this,RenderDeviceVkImpl *pObj)

{
  RenderDeviceVkImpl *pObj_local;
  RefCntAutoPtr<Diligent::RenderDeviceVkImpl> *this_local;
  
  this->m_pObject = pObj;
  if (this->m_pObject != (RenderDeviceVkImpl *)0x0) {
    RefCountedObject<Diligent::IRenderDeviceVk>::AddRef
              ((RefCountedObject<Diligent::IRenderDeviceVk> *)this->m_pObject);
  }
  return;
}

Assistant:

explicit RefCntAutoPtr(T* pObj) noexcept :
        m_pObject{pObj}
    {
        if (m_pObject)
            m_pObject->AddRef();
    }